

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitreader.h
# Opt level: O0

int aom_read_literal_(aom_reader *r,int bits)

{
  int iVar1;
  int in_ESI;
  int bit;
  int literal;
  undefined4 local_14;
  uint uVar2;
  
  uVar2 = 0;
  for (local_14 = in_ESI + -1; -1 < local_14; local_14 = local_14 + -1) {
    iVar1 = aom_read_bit_((aom_reader *)CONCAT44(in_ESI,uVar2));
    uVar2 = iVar1 << ((byte)local_14 & 0x1f) | uVar2;
  }
  return uVar2;
}

Assistant:

static inline int aom_read_literal_(aom_reader *r, int bits ACCT_STR_PARAM) {
  int literal = 0, bit;

  for (bit = bits - 1; bit >= 0; bit--) literal |= aom_read_bit(r, NULL) << bit;
#if CONFIG_ACCOUNTING
  if (ACCT_STR_NAME) aom_process_accounting(r, ACCT_STR_NAME);
#endif
  return literal;
}